

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O0

void __thiscall
ExchCXX::detail::LibxcKernelImpl::LibxcKernelImpl(LibxcKernelImpl *this,int kern,int spin_polar)

{
  int iVar1;
  runtime_error *this_00;
  int in_EDX;
  int in_ESI;
  xc_func_type *in_RDI;
  int info;
  xc_func_type *func;
  
  func = in_RDI;
  XCKernelImpl::XCKernelImpl((XCKernelImpl *)in_RDI);
  in_RDI->info = (xc_func_info_type *)&PTR__LibxcKernelImpl_01f92be8;
  in_RDI->nspin = in_EDX;
  *(undefined1 *)&in_RDI[1].func_aux = 0;
  iVar1 = xc_func_init(func,in_ESI,in_EDX);
  if (iVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Libxc Kernel Init Failed");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined1 *)&in_RDI[1].func_aux = 1;
  return;
}

Assistant:

LibxcKernelImpl::LibxcKernelImpl( 
  const int kern, 
  const int spin_polar
) : polar_(spin_polar) {

  // Initialize XC Kernel using Libxc
  int info = xc_func_init( &kernel_, kern, spin_polar );
  if( info )
    throw std::runtime_error("Libxc Kernel Init Failed");

  initialized_ = true;
}